

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Index * findIndexOrPrimaryKey(sqlite3 *db,char *zName,char *zDb)

{
  Index *pIVar1;
  Table *pTab;
  
  pIVar1 = sqlite3FindIndex(db,zName,zDb);
  if (pIVar1 == (Index *)0x0) {
    pTab = sqlite3FindTable(db,zName,zDb);
    if ((pTab != (Table *)0x0) && ((pTab->tabFlags & 0x20) != 0)) {
      pIVar1 = sqlite3PrimaryKeyIndex(pTab);
      return pIVar1;
    }
    pIVar1 = (Index *)0x0;
  }
  return pIVar1;
}

Assistant:

static Index *findIndexOrPrimaryKey(
  sqlite3 *db,
  const char *zName,
  const char *zDb
){
  Index *pIdx = sqlite3FindIndex(db, zName, zDb);
  if( pIdx==0 ){
    Table *pTab = sqlite3FindTable(db, zName, zDb);
    if( pTab && !HasRowid(pTab) ) pIdx = sqlite3PrimaryKeyIndex(pTab);
  }
  return pIdx;
}